

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

void ExtractAlphaRows(VP8LDecoder *dec,int last_row)

{
  int iVar1;
  uint32_t *puVar2;
  void *pvVar3;
  bool bVar4;
  uint32_t *rows;
  int start_row;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint num_rows;
  uint uVar7;
  uint8_t *puVar8;
  uint uVar9;
  
  start_row = dec->last_row;
  if (last_row - start_row != 0 && start_row <= last_row) {
    rows = dec->pixels + (long)dec->width * (long)start_row;
    uVar7 = last_row - start_row;
    do {
      num_rows = 0x10;
      if (uVar7 < 0x10) {
        num_rows = uVar7;
      }
      puVar2 = dec->argb_cache;
      pvVar3 = dec->io->opaque;
      iVar1 = dec->io->width;
      puVar5 = (uint8_t *)((long)(iVar1 * start_row) + *(long *)((long)pvVar3 + 200));
      ApplyInverseTransforms(dec,start_row,num_rows,rows);
      (*WebPExtractGreen)(puVar2,puVar5,iVar1 * num_rows);
      if (*(int *)((long)pvVar3 + 0xc) != 0) {
        puVar8 = *(uint8_t **)((long)pvVar3 + 0xd0);
        uVar9 = num_rows;
        do {
          puVar6 = puVar5;
          (*WebPUnfilters[*(uint *)((long)pvVar3 + 0xc)])(puVar8,puVar6,puVar6,iVar1);
          uVar9 = uVar9 - 1;
          puVar5 = puVar6 + iVar1;
          puVar8 = puVar6;
        } while (uVar9 != 0);
        *(long *)((long)pvVar3 + 0xd0) = (long)(puVar6 + iVar1) - (long)iVar1;
      }
      start_row = start_row + num_rows;
      rows = rows + (long)(int)num_rows * (long)dec->width;
      uVar9 = uVar7 - num_rows;
      bVar4 = (int)num_rows <= (int)uVar7;
      uVar7 = uVar9;
    } while (uVar9 != 0 && bVar4);
  }
  dec->last_out_row = last_row;
  dec->last_row = last_row;
  return;
}

Assistant:

static void ExtractAlphaRows(VP8LDecoder* const dec, int last_row) {
  int cur_row = dec->last_row;
  int num_rows = last_row - cur_row;
  const uint32_t* in = dec->pixels + dec->width * cur_row;

  assert(last_row <= dec->io->crop_bottom);
  while (num_rows > 0) {
    const int num_rows_to_process =
        (num_rows > NUM_ARGB_CACHE_ROWS) ? NUM_ARGB_CACHE_ROWS : num_rows;
    // Extract alpha (which is stored in the green plane).
    ALPHDecoder* const alph_dec = (ALPHDecoder*)dec->io->opaque;
    uint8_t* const output = alph_dec->output;
    const int width = dec->io->width;      // the final width (!= dec->width)
    const int cache_pixs = width * num_rows_to_process;
    uint8_t* const dst = output + width * cur_row;
    const uint32_t* const src = dec->argb_cache;
    ApplyInverseTransforms(dec, cur_row, num_rows_to_process, in);
    WebPExtractGreen(src, dst, cache_pixs);
    AlphaApplyFilter(alph_dec,
                     cur_row, cur_row + num_rows_to_process, dst, width);
    num_rows -= num_rows_to_process;
    in += num_rows_to_process * dec->width;
    cur_row += num_rows_to_process;
  }
  assert(cur_row == last_row);
  dec->last_row = dec->last_out_row = last_row;
}